

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.hpp
# Opt level: O3

int __thiscall io::posix::mmap_file::open(mmap_file *this,char *__file,int __oflag,...)

{
  void *pvVar1;
  off_t oVar2;
  int *piVar3;
  __off_t size;
  error_category *extraout_RAX;
  uint in_ECX;
  uint uVar4;
  error_code *in_R8;
  file_descriptor_handle new_fd;
  mmap_handle mmap;
  file_descriptor_handle local_58;
  mmap_file *local_50;
  error_category *local_48;
  mmap_handle local_40;
  
  local_50 = this;
  local_48 = (error_category *)std::_V2::system_category();
  in_R8->_M_value = 0;
  in_R8->_M_cat = local_48;
  piVar3 = __errno_location();
  *piVar3 = 0;
  uVar4 = 0xc0;
  if ((__oflag & 0x40U) == 0) {
    uVar4 = __oflag * 2 & 0x40;
  }
  local_58.fd_ = ::open(*(char **)__file,uVar4 | (__oflag & 0x18U) << 6 | (uint)__oflag >> 1 & 3,
                        (ulong)in_ECX);
  if (local_58.fd_ < 0) {
    in_R8->_M_value = *piVar3;
    in_R8->_M_cat = local_48;
  }
  else {
    local_58.delete_ = true;
    size = lseek(local_58.fd_,0,2);
    if (size == -1) {
      in_R8->_M_value = *piVar3;
      in_R8->_M_cat = local_48;
    }
    else {
      detail::mmap_handle::create(&local_40,&local_58,size,__oflag,in_R8);
      if ((in_R8->_M_value == 0) && (&local_40 != &local_50->mmap_)) {
        pvVar1 = (local_50->mmap_).addr_;
        (local_50->mmap_).addr_ = local_40.addr_;
        oVar2 = (local_50->mmap_).size_;
        (local_50->mmap_).size_ = local_40.size_;
        local_40.addr_ = pvVar1;
        local_40.size_ = oVar2;
      }
      detail::mmap_handle::~mmap_handle(&local_40);
    }
    file_descriptor_handle::~file_descriptor_handle(&local_58);
    local_48 = extraout_RAX;
  }
  return (int)local_48;
}

Assistant:

void open(const io_std::filesystem::path& path,
              open_mode mode,
              io_std::filesystem::perms create_perms,
              std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        // First, try to open the file
        int raw_fd = ::open(path.c_str(), detail::open_mode_to_posix_mode(mode),
                            static_cast<::mode_t>(create_perms));
        if (raw_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }
        file_descriptor_handle new_fd{raw_fd};

        // Now seek to the end to find the file size
        offset_type size = ::lseek(new_fd.get(), 0, SEEK_END);
        if (size == -1) {
            ec.assign(errno, std::system_category());
            return;
        }

        auto mmap = detail::mmap_handle::create(new_fd, size, mode, ec);
        if (ec) {
            return;
        }

        this->mmap_ = std::move(mmap);
    }